

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring.c
# Opt level: O3

pchar * p_strdup(pchar *str)

{
  size_t sVar1;
  ppointer __dest;
  pchar *ppVar2;
  
  if (str != (pchar *)0x0) {
    sVar1 = strlen(str);
    __dest = p_malloc(sVar1 + 1);
    if (__dest != (ppointer)0x0) {
      ppVar2 = (pchar *)memcpy(__dest,str,sVar1 + 1);
      return ppVar2;
    }
  }
  return (pchar *)0x0;
}

Assistant:

P_LIB_API pchar *
p_strdup (const pchar *str)
{
	pchar	*ret;
	psize	len;

	if (P_UNLIKELY (str == NULL))
		return NULL;

	len = strlen (str) + 1;

	if (P_UNLIKELY ((ret = p_malloc (len)) == NULL))
		return NULL;

	memcpy (ret, str, len);

	return ret;
}